

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtablez_sampler.cc
# Opt level: O0

HashtablezInfo *
absl::lts_20240722::container_internal::SampleSlow
          (SamplingState *next_sample,size_t inline_element_size,size_t key_size,size_t value_size,
          uint16_t soo_capacity)

{
  bool bVar1;
  HashtablezSampler *this;
  long lVar2;
  long lVar3;
  HashtablezInfo *result;
  long local_40;
  int64_t old_stride;
  size_t sStack_30;
  uint16_t soo_capacity_local;
  size_t value_size_local;
  size_t key_size_local;
  size_t inline_element_size_local;
  SamplingState *next_sample_local;
  
  old_stride._6_2_ = soo_capacity;
  sStack_30 = value_size;
  value_size_local = key_size;
  key_size_local = inline_element_size;
  inline_element_size_local = (size_t)next_sample;
  bVar1 = ShouldForceSampling();
  if (bVar1) {
    *(undefined8 *)inline_element_size_local = 1;
    result._4_4_ = 1;
    local_40 = std::exchange<long,int>
                         ((long *)(inline_element_size_local + 8),(int *)((long)&result + 4));
    this = GlobalHashtablezSampler();
    next_sample_local =
         (SamplingState *)
         profiling_internal::SampleRecorder<absl::lts_20240722::container_internal::HashtablezInfo>
         ::Register<long_const&,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_short&>
                   (this,&local_40,&key_size_local,&value_size_local,&stack0xffffffffffffffd0,
                    (unsigned_short *)((long)&old_stride + 6));
  }
  else {
    lVar2 = std::numeric_limits<long>::max();
    lVar3 = std::numeric_limits<long>::max();
    *(long *)inline_element_size_local = lVar2;
    *(long *)(inline_element_size_local + 8) = lVar3;
    next_sample_local = (SamplingState *)0x0;
  }
  return (HashtablezInfo *)next_sample_local;
}

Assistant:

HashtablezInfo* SampleSlow(SamplingState& next_sample,
                           size_t inline_element_size, size_t key_size,
                           size_t value_size, uint16_t soo_capacity) {
  if (ABSL_PREDICT_FALSE(ShouldForceSampling())) {
    next_sample.next_sample = 1;
    const int64_t old_stride = exchange(next_sample.sample_stride, 1);
    HashtablezInfo* result = GlobalHashtablezSampler().Register(
        old_stride, inline_element_size, key_size, value_size, soo_capacity);
    return result;
  }

#if !defined(ABSL_INTERNAL_HASHTABLEZ_SAMPLE)
  next_sample = {
      std::numeric_limits<int64_t>::max(),
      std::numeric_limits<int64_t>::max(),
  };
  return nullptr;
#else
  bool first = next_sample.next_sample < 0;

  const int64_t next_stride = g_exponential_biased_generator.GetStride(
      g_hashtablez_sample_parameter.load(std::memory_order_relaxed));

  next_sample.next_sample = next_stride;
  const int64_t old_stride = exchange(next_sample.sample_stride, next_stride);
  // Small values of interval are equivalent to just sampling next time.
  ABSL_ASSERT(next_stride >= 1);

  // g_hashtablez_enabled can be dynamically flipped, we need to set a threshold
  // low enough that we will start sampling in a reasonable time, so we just use
  // the default sampling rate.
  if (!g_hashtablez_enabled.load(std::memory_order_relaxed)) return nullptr;

  // We will only be negative on our first count, so we should just retry in
  // that case.
  if (first) {
    if (ABSL_PREDICT_TRUE(--next_sample.next_sample > 0)) return nullptr;
    return SampleSlow(next_sample, inline_element_size, key_size, value_size,
                      soo_capacity);
  }

  return GlobalHashtablezSampler().Register(old_stride, inline_element_size,
                                            key_size, value_size, soo_capacity);
#endif
}